

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

void __thiscall
dg::llvmdg::legacy::GraphBuilder::handleCallInstruction
          (GraphBuilder *this,Instruction *instruction,Block *lastBlock,bool *createBlock,
          bool *createCallReturn)

{
  Function *llvmFunction;
  bool bVar1;
  Function *function;
  pointer ppFVar2;
  undefined1 auVar3 [16];
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> llvmFunctions;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  
  getCalledFunctions(&local_48,this,*(Value **)(instruction + -0x20));
  for (ppFVar2 = local_48.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 !=
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    llvmFunction = *ppFVar2;
    if (*(Function **)(llvmFunction + 0x48) == llvmFunction + 0x48) {
      if (this->threads == true) {
        auVar3 = llvm::Value::getName();
        if ((auVar3._8_8_ == 0xe) &&
           (*(long *)((long)auVar3._0_8_ + 6) == 0x6574616572635f64 &&
            *auVar3._0_8_ == 0x5f64616572687470)) {
          bVar1 = createPthreadCreate(this,(CallInst *)instruction,lastBlock);
          *createBlock = (bool)(*createBlock | bVar1);
        }
        else {
          auVar3 = llvm::Value::getName();
          if ((auVar3._8_8_ == 0xc) &&
             ((int)auVar3._0_8_[1] == 0x6e696f6a && *auVar3._0_8_ == 0x5f64616572687470)) {
            bVar1 = createPthreadJoin(this,(CallInst *)instruction,lastBlock);
            *createCallReturn = (bool)(*createCallReturn | bVar1);
          }
        }
      }
    }
    else {
      function = createOrGetFunction(this,llvmFunction);
      Block::addCallee(lastBlock,llvmFunction,function);
      *createCallReturn = true;
    }
  }
  if (local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GraphBuilder::handleCallInstruction(const llvm::Instruction *instruction,
                                         Block *lastBlock, bool &createBlock,
                                         bool &createCallReturn) {
    const auto *callInst = llvm::cast<llvm::CallInst>(instruction);
#if LLVM_VERSION_MAJOR >= 8
    auto *val = callInst->getCalledOperand();
#else
    auto *val = callInst->getCalledValue();
#endif
    auto llvmFunctions = getCalledFunctions(val);

    for (const auto *llvmFunction : llvmFunctions) {
        if (!llvmFunction->empty()) {
            auto *function = createOrGetFunction(llvmFunction);
            lastBlock->addCallee(llvmFunction, function);
            createCallReturn |= true;
        } else if (threads) {
            if (llvmFunction->getName() == "pthread_create") {
                createBlock |= createPthreadCreate(callInst, lastBlock);
            } else if (llvmFunction->getName() == "pthread_join") {
                createCallReturn |= createPthreadJoin(callInst, lastBlock);
            }
        }
    }
}